

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_374d6::SimpleFixtureDefaultFixtureCtorIsCalledHelper::RunImpl
          (SimpleFixtureDefaultFixtureCtorIsCalledHelper *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_40;
  SimpleFixtureDefaultFixtureCtorIsCalledHelper *local_10;
  SimpleFixtureDefaultFixtureCtorIsCalledHelper *this_local;
  
  local_10 = this;
  bVar1 = UnitTest::Check<bool>(0 < (anonymous_namespace)::SimpleFixture::instanceCount);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x8a);
    UnitTest::TestResults::OnTestFailure(this_00,&local_40,"SimpleFixture::instanceCount > 0");
  }
  return;
}

Assistant:

TEST_FIXTURE(SimpleFixture, DefaultFixtureCtorIsCalled)
{
    CHECK(SimpleFixture::instanceCount > 0);
}